

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall
ON_3dVector::PerpendicularTo(ON_3dVector *this,ON_3dPoint *P0,ON_3dPoint *P1,ON_3dPoint *P2)

{
  bool bVar1;
  ON_3dVector *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector V0;
  ON_3dVector V2;
  ON_3dVector V1;
  ON_3dVector N0;
  ON_3dVector N2;
  ON_3dVector N1;
  ON_3dVector local_170;
  ON_3dVector local_158;
  ON_3dVector local_140;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  ON_3dVector local_f8;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  this->z = ZeroVector.z;
  dVar5 = ZeroVector.y;
  this->x = ZeroVector.x;
  this->y = dVar5;
  ON_3dVector(&local_170,P2->x - P1->x,P2->y - P1->y,P2->z - P1->z);
  ON_3dVector(&local_140,P0->x - P2->x,P0->y - P2->y,P0->z - P2->z);
  ON_3dVector(&local_158,P1->x - P0->x,P1->y - P0->y,P1->z - P0->z);
  ON_3dVector(&local_f8,local_140.y * local_158.z - local_140.z * local_158.y,
              local_140.z * local_158.x - local_158.z * local_140.x,
              local_140.x * local_158.y - local_140.y * local_158.x);
  bVar1 = Unitize(&local_f8);
  if (bVar1) {
    ON_3dVector(&local_c0,local_158.y * local_170.z - local_158.z * local_170.y,
                local_158.z * local_170.x - local_170.z * local_158.x,
                local_158.x * local_170.y - local_158.y * local_170.x);
    bVar1 = Unitize(&local_c0);
    if (bVar1) {
      ON_3dVector(&local_d8,local_170.y * local_140.z - local_170.z * local_140.y,
                  local_170.z * local_140.x - local_140.z * local_170.x,
                  local_170.x * local_140.y - local_170.y * local_140.x);
      bVar1 = Unitize(&local_d8);
      if (!bVar1) {
        return bVar1;
      }
      local_108 = local_170.x;
      uStack_100 = 0;
      local_118 = local_170.y;
      uStack_110 = 0;
      local_a8 = local_170.z;
      uStack_a0 = 0;
      local_38 = ON_Length3d(local_170.x,local_170.y,local_170.z);
      local_38 = 1.0 / local_38;
      uStack_30 = 0;
      local_98 = local_140.x;
      uStack_90 = 0;
      local_128 = local_140.y;
      uStack_120 = 0;
      local_88 = local_140.z;
      uStack_80 = 0;
      local_78 = ON_Length3d(local_140.x,local_140.y,local_140.z);
      local_78 = 1.0 / local_78;
      uStack_70 = 0;
      local_58 = local_158.x;
      uStack_50 = 0;
      local_68 = local_158.y;
      uStack_60 = 0;
      local_48 = local_158.z;
      uStack_40 = 0;
      dVar5 = ON_Length3d(local_158.x,local_158.y,local_158.z);
      dVar5 = 1.0 / dVar5;
      dVar3 = dVar5 * ABS(local_48 * local_f8.z + local_58 * local_f8.x + local_68 * local_f8.y) +
              local_38 *
              ABS(local_a8 * local_f8.z + local_108 * local_f8.x + local_118 * local_f8.y) +
              local_78 * ABS(local_88 * local_f8.z + local_98 * local_f8.x + local_128 * local_f8.y)
      ;
      dVar4 = dVar5 * ABS(local_48 * local_c0.z + local_58 * local_c0.x + local_68 * local_c0.y) +
              local_38 *
              ABS(local_a8 * local_c0.z + local_108 * local_c0.x + local_118 * local_c0.y) +
              local_78 * ABS(local_88 * local_c0.z + local_98 * local_c0.x + local_128 * local_c0.y)
      ;
      pOVar2 = &local_f8;
      if (dVar4 < dVar3) {
        pOVar2 = &local_c0;
      }
      if (ABS(local_d8.z * local_48 + local_d8.x * local_58 + local_68 * local_d8.y) * dVar5 +
          ABS(local_a8 * local_d8.z + local_108 * local_d8.x + local_118 * local_d8.y) * local_38 +
          ABS(local_88 * local_d8.z + local_98 * local_d8.x + local_128 * local_d8.y) * local_78 <
          (double)(~-(ulong)(dVar4 < dVar3) & (ulong)dVar3 | (ulong)dVar4 & -(ulong)(dVar4 < dVar3))
         ) {
        pOVar2 = &local_d8;
      }
      dVar5 = pOVar2->y;
      this->x = pOVar2->x;
      this->y = dVar5;
      this->z = pOVar2->z;
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
ON_3dVector::PerpendicularTo( 
      const ON_3dPoint& P0, const ON_3dPoint& P1, const ON_3dPoint& P2
      )
{
  // Find a the unit normal to a triangle defined by 3 points
  *this = ON_3dVector::ZeroVector;

  ON_3dVector V0 = P2 - P1;
  ON_3dVector V1 = P0 - P2;
  ON_3dVector V2 = P1 - P0;

  ON_3dVector N0 = ON_CrossProduct( V1, V2 );
  if ( !N0.Unitize() )
    return false;
  ON_3dVector N1 = ON_CrossProduct( V2, V0 );
  if ( !N1.Unitize() )
    return false;
  ON_3dVector N2 = ON_CrossProduct( V0, V1 );
  if ( !N2.Unitize() )
    return false;

  const double s0 = 1.0/V0.Length();
  const double s1 = 1.0/V1.Length();
  const double s2 = 1.0/V2.Length();

  // choose normal with smallest total error
  const double e0 = s0*fabs(ON_DotProduct(N0,V0)) + s1*fabs(ON_DotProduct(N0,V1)) + s2*fabs(ON_DotProduct(N0,V2));
  const double e1 = s0*fabs(ON_DotProduct(N1,V0)) + s1*fabs(ON_DotProduct(N1,V1)) + s2*fabs(ON_DotProduct(N1,V2));
  const double e2 = s0*fabs(ON_DotProduct(N2,V0)) + s1*fabs(ON_DotProduct(N2,V1)) + s2*fabs(ON_DotProduct(N2,V2));

  if ( e0 <= e1 ) {
    if ( e0 <= e2 ) {
      *this = N0;
    }
    else {
      *this = N2;
    }
  }
  else if (e1 <= e2) {
    *this = N1;
  }
  else {
    *this = N2;
  }
  
  return true;
}